

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# any_executor.hpp
# Opt level: O1

void __thiscall
asio::execution::detail::any_executor_base::any_executor_base
          (any_executor_base *this,any_executor_base *other)

{
  object_fns *poVar1;
  
  if (other->target_ == (void *)0x0) {
    this->object_fns_ = (object_fns *)0x0;
    this->target_ = (void *)0x0;
    this->target_fns_ = (target_fns *)0x0;
  }
  else {
    poVar1 = other->object_fns_;
    this->object_fns_ = poVar1;
    this->target_fns_ = other->target_fns_;
    (*poVar1->copy)(this,other);
  }
  return;
}

Assistant:

any_executor_base(const any_executor_base& other) noexcept
  {
    if (!!other)
    {
      object_fns_ = other.object_fns_;
      target_fns_ = other.target_fns_;
      object_fns_->copy(*this, other);
    }
    else
    {
      object_fns_ = 0;
      target_ = 0;
      target_fns_ = 0;
    }
  }